

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer_reserve(ptls_buffer_t *buf,size_t delta)

{
  void *__dest;
  long in_RSI;
  long *in_RDI;
  size_t new_capacity;
  uint8_t *newp;
  ulong local_28;
  int local_4;
  
  if (*in_RDI == 0) {
    local_4 = 0x201;
  }
  else {
    if ((ulong)in_RDI[1] < (ulong)(in_RDI[2] + in_RSI)) {
      local_28 = in_RDI[1];
      if (local_28 < 0x400) {
        local_28 = 0x400;
      }
      for (; local_28 < (ulong)(in_RDI[2] + in_RSI); local_28 = local_28 << 1) {
      }
      __dest = malloc(local_28);
      if (__dest == (void *)0x0) {
        return 0x201;
      }
      memcpy(__dest,(void *)*in_RDI,in_RDI[2]);
      ptls_buffer__release_memory((ptls_buffer_t *)0x1095be);
      *in_RDI = (long)__dest;
      in_RDI[1] = local_28;
      *(undefined4 *)(in_RDI + 3) = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ptls_buffer_reserve(ptls_buffer_t *buf, size_t delta)
{
    if (buf->base == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if (PTLS_MEMORY_DEBUG || buf->capacity < buf->off + delta) {
        uint8_t *newp;
        size_t new_capacity = buf->capacity;
        if (new_capacity < 1024)
            new_capacity = 1024;
        while (new_capacity < buf->off + delta) {
            new_capacity *= 2;
        }
        if ((newp = malloc(new_capacity)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(newp, buf->base, buf->off);
        ptls_buffer__release_memory(buf);
        buf->base = newp;
        buf->capacity = new_capacity;
        buf->is_allocated = 1;
    }

    return 0;
}